

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O1

void glfwDestroyCursor(GLFWcursor *handle)

{
  _GLFWcursor *p_Var1;
  _GLFWcursor *p_Var2;
  _GLFWwindow *windowHandle;
  
  if (_glfwInitialized == '\0') {
    _glfwInputError(0x10001,(char *)0x0);
    return;
  }
  windowHandle = _glfw.windowListHead;
  if (handle == (GLFWcursor *)0x0) {
    return;
  }
  for (; windowHandle != (_GLFWwindow *)0x0; windowHandle = windowHandle->next) {
    if (windowHandle->cursor == (_GLFWcursor *)handle) {
      glfwSetCursor((GLFWwindow *)windowHandle,(GLFWcursor *)0x0);
    }
  }
  _glfwPlatformDestroyCursor((_GLFWcursor *)handle);
  p_Var1 = (_GLFWcursor *)&_glfw.cursorListHead;
  do {
    p_Var2 = p_Var1;
    p_Var1 = p_Var2->next;
  } while (p_Var1 != (_GLFWcursor *)handle);
  p_Var2->next = *(_GLFWcursor **)handle;
  free(handle);
  return;
}

Assistant:

GLFWAPI void glfwDestroyCursor(GLFWcursor* handle)
{
    _GLFWcursor* cursor = (_GLFWcursor*) handle;

    _GLFW_REQUIRE_INIT();

    if (cursor == NULL)
        return;

    // Make sure the cursor is not being used by any window
    {
        _GLFWwindow* window;

        for (window = _glfw.windowListHead;  window;  window = window->next)
        {
            if (window->cursor == cursor)
                glfwSetCursor((GLFWwindow*) window, NULL);
        }
    }

    _glfwPlatformDestroyCursor(cursor);

    // Unlink cursor from global linked list
    {
        _GLFWcursor** prev = &_glfw.cursorListHead;

        while (*prev != cursor)
            prev = &((*prev)->next);

        *prev = cursor->next;
    }

    free(cursor);
}